

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall SSTable::writeToDisk(SSTable *this,path *dst_file)

{
  SSTableDataEntry *pSVar1;
  pointer pSVar2;
  SSTableDataEntry *item;
  SSTableDataEntry *s;
  pointer pSVar3;
  ofstream os;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(dst_file->_M_pathname)._M_dataplus._M_p,_S_out|_S_bin);
  operator<<((ofstream *)&local_228,this->header);
  pSVar1 = (this->data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (s = (this->data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_start; s != pSVar1; s = s + 1) {
    operator<<((ofstream *)&local_228,s);
  }
  pSVar2 = (this->index->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->index->
                super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
                super__Vector_impl_data._M_start; pSVar3 != pSVar2; pSVar3 = pSVar3 + 1) {
    std::ostream::write((char *)&local_228,(long)pSVar3);
    std::ostream::write((char *)&local_228,(long)&pSVar3->offset);
  }
  std::ostream::flush();
  std::ofstream::close();
  std::filesystem::__cxx11::path::operator=(&this->file,dst_file);
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void SSTable::writeToDisk(const path &dst_file) {
    auto os = create_binary_ofstream(dst_file);
    os << *header;
    for (const auto &item:*data) {
        os << item;
    }
    for (const auto &item:*index) {
        os << item;
    }
    os.flush();
    os.close();
    file = dst_file; // Make connection between SSTable object and disk file.
}